

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

Own<kj::_::ForkHub<capnproto_test::capnp::test::TestInterface::Client>,_kj::_::ForkHubBase>
__thiscall
kj::_::PromiseDisposer::
alloc<kj::_::ForkHub<capnproto_test::capnp::test::TestInterface::Client>,kj::_::ForkHubBase,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
          (PromiseDisposer *this,Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params,
          SourceLocation *params_1)

{
  void *pvVar1;
  
  pvVar1 = operator_new(0x400);
  *(undefined ***)((long)pvVar1 + 0x1d0) = &PTR_destroy_006e6f98;
  *(undefined **)((long)pvVar1 + 0x1e0) = &DAT_006e6fc0;
  ForkHubBase::ForkHubBase
            ((ForkHubBase *)((long)pvVar1 + 0x1d0),params,(ExceptionOrValue *)((long)pvVar1 + 0x248)
             ,*params_1);
  *(undefined ***)((long)pvVar1 + 0x1d0) = &PTR_destroy_006e6f98;
  *(undefined **)((long)pvVar1 + 0x1e0) = &DAT_006e6fc0;
  *(undefined1 *)((long)pvVar1 + 0x248) = 0;
  *(undefined1 *)((long)pvVar1 + 0x3e0) = 0;
  *(void **)((long)pvVar1 + 0x1d8) = pvVar1;
  *(ForkHubBase **)this = (ForkHubBase *)((long)pvVar1 + 0x1d0);
  return (Own<kj::_::ForkHub<capnproto_test::capnp::test::TestInterface::Client>,_kj::_::ForkHubBase>
          )(ForkHub<capnproto_test::capnp::test::TestInterface::Client> *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }